

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O1

MaybeResult<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::
memory<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
          (MaybeResult<wasm::WATParser::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  undefined1 *puVar1;
  undefined8 *puVar2;
  bool bVar3;
  bool bVar4;
  optional<unsigned_int> oVar5;
  _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *p_Var6;
  _Alloc_hider _Var7;
  ParseInput *this;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  string_view expected_03;
  optional<unsigned_long> oVar8;
  undefined1 local_178 [8];
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> exports;
  MaybeResult<wasm::WATParser::(anonymous_namespace)::ImportNames> import;
  undefined8 local_118;
  string local_108;
  string local_e8;
  undefined1 local_c8 [8];
  Result<wasm::WATParser::Ok> type;
  size_type __dnew;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined1 local_78 [8];
  optional<wasm::Name> id;
  __index_type local_58;
  undefined1 local_50 [8];
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> str;
  __index_type local_30;
  
  this = &ctx->in;
  ParseInput::getPos(this);
  expected._M_str = "memory";
  expected._M_len = 6;
  bVar3 = ParseInput::takeSExprStart(this,expected);
  if (!bVar3) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
     + 0x20) = '\x01';
    return __return_storage_ptr__;
  }
  ParseInput::takeID((optional<wasm::Name> *)local_78,this);
  inlineExports((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_178,this);
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
                     *)local_78,
                    (_Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
                     *)local_178);
  if (local_58 == '\x01') {
    puVar1 = (undefined1 *)
             ((long)&str.
                     super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                     ._M_payload + 8);
    local_50 = (undefined1  [8])puVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,local_78,
               (undefined1 *)
               (id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                _M_len + (long)local_78));
    puVar2 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).
      super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
         = puVar2;
    if (local_50 == (undefined1  [8])puVar1) {
      *puVar2 = CONCAT71(str.
                         super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                         ._M_payload._9_7_,
                         str.
                         super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                         ._M_payload._8_1_);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
       + 0x18) = str.
                 super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                 ._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).
        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           = local_50;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                + 0x10) =
           CONCAT71(str.
                    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                    ._M_payload._9_7_,
                    str.
                    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                    ._M_payload._8_1_);
    }
    *(size_t *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
     + 8) = str.
            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
            _M_payload.
            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
            _M_payload._M_value._M_len;
    str.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._M_value._M_len = 0;
    str.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._8_1_ = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
     + 0x20) = '\x02';
    local_50 = (undefined1  [8])puVar1;
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
                         *)local_78);
    goto LAB_009f83b8;
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
  ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
                       *)local_78);
  inlineImport((MaybeResult<wasm::WATParser::(anonymous_namespace)::ImportNames> *)
               ((long)&exports.val.
                       super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
                       .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err> + 0x20)
               ,this);
  MaybeResult<wasm::WATParser::(anonymous_namespace)::ImportNames>::MaybeResult
            ((MaybeResult<wasm::WATParser::(anonymous_namespace)::ImportNames> *)local_78,
             (MaybeResult<wasm::WATParser::(anonymous_namespace)::ImportNames> *)
             ((long)&exports.val.
                     super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
                     .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err> + 0x20));
  if (local_58 == '\x02') {
    puVar1 = (undefined1 *)
             ((long)&str.
                     super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                     ._M_payload + 8);
    local_50 = (undefined1  [8])puVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,local_78,
               (undefined1 *)
               (id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                _M_len + (long)local_78));
    puVar2 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).
      super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
         = puVar2;
    if (local_50 == (undefined1  [8])puVar1) {
      *puVar2 = CONCAT71(str.
                         super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                         ._M_payload._9_7_,
                         str.
                         super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                         ._M_payload._8_1_);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
       + 0x18) = str.
                 super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                 ._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).
        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           = local_50;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                + 0x10) =
           CONCAT71(str.
                    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                    ._M_payload._9_7_,
                    str.
                    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                    ._M_payload._8_1_);
    }
    *(size_t *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
     + 8) = str.
            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
            _M_payload.
            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
            _M_payload._M_value._M_len;
    str.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._M_value._M_len = 0;
    str.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._8_1_ = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
     + 0x20) = '\x02';
    local_50 = (undefined1  [8])puVar1;
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                         *)local_78);
  }
  else {
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                         *)local_78);
    expected_00._M_str = "data";
    expected_00._M_len = 4;
    bVar3 = ParseInput::takeSExprStart(this,expected_00);
    if (bVar3) {
      if (import.val.
          super__Variant_base<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Move_assign_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Move_ctor_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_ctor_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Variant_storage_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
          ._M_u._24_1_ == '\x01') {
        do {
          ParseInput::takeString
                    ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_50,
                     this);
        } while (str.
                 super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                 ._M_payload._8_1_ != '\0');
        std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)
                          local_50,(_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>
                                    *)local_78);
        if (local_30 != '\x01') {
          std::__detail::__variant::
          _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_50)
          ;
          bVar4 = ParseInput::takeRParen(this);
          if (!bVar4) {
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_108,"expected end of inline data","");
            ParseInput::err((Err *)local_50,this,&local_108);
            puVar2 = (undefined8 *)
                     ((long)&(__return_storage_ptr__->val).
                             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     + 0x10);
            *(undefined8 **)
             &(__return_storage_ptr__->val).
              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 = puVar2;
            puVar1 = (undefined1 *)
                     ((long)&str.
                             super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                             ._M_payload + 8);
            if (local_50 == (undefined1  [8])puVar1) {
              *puVar2 = CONCAT71(str.
                                 super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                                 ._M_payload._9_7_,
                                 str.
                                 super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                                 ._M_payload._8_1_);
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               + 0x18) = str.
                         super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                         ._16_8_;
            }
            else {
              *(undefined1 (*) [8])
               &(__return_storage_ptr__->val).
                super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   = local_50;
              *(ulong *)((long)&(__return_storage_ptr__->val).
                                super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        + 0x10) =
                   CONCAT71(str.
                            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                            ._M_payload._9_7_,
                            str.
                            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                            ._M_payload._8_1_);
            }
            *(size_t *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             + 8) = str.
                    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                    ._M_payload._M_value._M_len;
            str.
            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
            _M_payload.
            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
            _M_payload._M_value._M_len = 0;
            str.
            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
            _M_payload.
            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
            _M_payload._8_1_ = 0;
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             + 0x20) = '\x02';
            local_50 = (undefined1  [8])puVar1;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1
                             );
            }
            goto LAB_009f83a3;
          }
          p_Var6 = (_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_78;
          goto LAB_009f81b5;
        }
        puVar1 = (undefined1 *)
                 ((long)&type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 8);
        local_c8 = (undefined1  [8])puVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_c8,local_50,
                   (undefined1 *)
                   (str.
                    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                    ._M_payload._M_value._M_len + (long)local_50));
        puVar2 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             = puVar2;
        if (local_c8 == (undefined1  [8])puVar1) {
          *puVar2 = type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                    super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                    super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                    super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                    super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u.
                    _8_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           + 0x18) = type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u.
                     _16_8_;
        }
        else {
          *(undefined1 (*) [8])
           &(__return_storage_ptr__->val).
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               = local_c8;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           + 0x10) = type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u.
                     _8_8_;
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
         + 8) = type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._0_8_;
        type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._0_8_ = 0;
        type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._8_8_ =
             type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._8_8_ &
             0xffffffffffffff00;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
         + 0x20) = '\x02';
        local_c8 = (undefined1  [8])puVar1;
        std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>
        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)
                            local_50);
LAB_009f83a3:
        p_Var6 = (_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_78;
LAB_009f83a7:
        std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>
        ::~_Variant_storage(p_Var6);
      }
      else {
        import.val.
        super__Variant_base<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
        .
        super__Move_assign_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
        .
        super__Copy_assign_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
        .
        super__Move_ctor_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
        .
        super__Copy_ctor_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
        .
        super__Variant_storage_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
        ._32_8_ = &stack0xfffffffffffffee8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   ((long)&import.val.
                           super__Variant_base<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                   + 0x20),"imported memories cannot have inline data","");
        ParseInput::err((Err *)local_78,this,
                        (string *)
                        ((long)&import.val.
                                super__Variant_base<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Move_assign_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Copy_assign_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Move_ctor_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Copy_ctor_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                        + 0x20));
        puVar2 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             = puVar2;
        puVar1 = (undefined1 *)
                 ((long)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Name>._M_payload + 8);
        if (local_78 == (undefined1  [8])puVar1) {
          *puVar2 = id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                    _M_str;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           + 0x18) = id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Name>._16_8_;
        }
        else {
          *(undefined1 (*) [8])
           &(__return_storage_ptr__->val).
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               = local_78;
          *(char **)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                    + 0x10) =
               id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_str
          ;
        }
        *(size_t *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
         + 8) = id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                _M_len;
        id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len = 0;
        id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_str =
             (char *)((ulong)id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                             super__Optional_payload_base<wasm::Name>._M_payload._M_value.
                             super_IString.str._M_str & 0xffffffffffffff00);
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
         + 0x20) = '\x02';
        _Var7._M_p = (pointer)import.val.
                              super__Variant_base<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Move_assign_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Copy_assign_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Move_ctor_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Variant_storage_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                              ._32_8_;
        local_78 = (undefined1  [8])puVar1;
        if ((undefined8 *)
            import.val.
            super__Variant_base<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_assign_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
            ._32_8_ == &stack0xfffffffffffffee8) goto LAB_009f83ac;
LAB_009f831f:
        local_78 = (undefined1  [8])
                   ((long)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::Name>._M_payload + 8);
        id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len = 0;
        operator_delete(_Var7._M_p,local_118 + 1);
      }
    }
    else {
      expected_01._M_str = "i64";
      expected_01._M_len = 3;
      bVar4 = ParseInput::takeKeyword(this,expected_01);
      if (bVar4) {
        oVar8 = ParseInput::takeU64(this);
        if (((undefined1  [16])
             oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
            (undefined1  [16])0x0) {
          ParseInput::takeU64(this);
          goto LAB_009f7ff9;
        }
        __dnew = (size_type)&local_88;
        type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_index = '\x15';
        type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._33_7_ = 0;
        __dnew = std::__cxx11::string::_M_create
                           (&__dnew,(ulong)((long)&type.val.
                                                  super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                           + 0x20));
        local_88._M_allocated_capacity =
             type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._32_8_;
        builtin_strncpy((char *)__dnew,"expected initial size",0x15);
        local_90 = type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._32_8_;
        *(char *)(__dnew + type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           _32_8_) = '\0';
        ParseInput::err((Err *)local_50,this,(string *)&__dnew);
LAB_009f7fce:
        local_78 = (undefined1  [8])
                   ((long)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::Name>._M_payload + 8);
        puVar1 = (undefined1 *)
                 ((long)&str.
                         super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                         ._M_payload + 8);
        if (local_50 == (undefined1  [8])puVar1) {
          id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Name>._M_engaged =
               str.
               super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
               _M_engaged;
          id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Name>._17_7_ =
               str.
               super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
               _17_7_;
        }
        else {
          local_78 = local_50;
        }
        id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_payload._9_7_ =
             str.
             super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
             _M_payload._9_7_;
        id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_payload._8_1_ =
             str.
             super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
             _M_payload._8_1_;
        id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len =
             str.
             super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
             _M_payload._M_value._M_len;
        str.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_payload._M_value._M_len = 0;
        str.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_payload._8_1_ = 0;
        bVar4 = true;
        local_50 = (undefined1  [8])puVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__dnew != &local_88) {
          operator_delete((void *)__dnew,local_88._M_allocated_capacity + 1);
        }
      }
      else {
        expected_02._M_str = "i32";
        expected_02._M_len = 3;
        ParseInput::takeKeyword(this,expected_02);
        oVar5 = ParseInput::takeU32(this);
        if (((ulong)oVar5.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
          __dnew = (size_type)&local_88;
          type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_index = '\x15';
          type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._33_7_ = 0;
          __dnew = std::__cxx11::string::_M_create
                             (&__dnew,(ulong)((long)&type.val.
                                                  super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                             + 0x20));
          local_88._M_allocated_capacity =
               type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._32_8_;
          builtin_strncpy((char *)__dnew,"expected initial size",0x15);
          local_90 = type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._32_8_;
          *(char *)(__dnew + type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
                             .super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                             ._32_8_) = '\0';
          ParseInput::err((Err *)local_50,this,(string *)&__dnew);
          goto LAB_009f7fce;
        }
        ParseInput::takeU32(this);
LAB_009f7ff9:
        bVar4 = false;
      }
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_50,
                      (_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_78)
      ;
      if (local_30 == '\x01') {
        __dnew = (size_type)&local_88;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__dnew,local_50,
                   (undefined1 *)
                   (str.
                    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                    ._M_payload._M_value._M_len + (long)local_50));
        local_c8 = (undefined1  [8])
                   ((long)&type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__dnew == &local_88) {
          type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._16_8_ =
               local_88._8_8_;
        }
        else {
          local_c8 = (undefined1  [8])__dnew;
        }
        type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._8_8_ =
             local_88._M_allocated_capacity;
        type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._0_8_ =
             local_90;
        type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._24_1_ = 1;
        std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>
        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)
                            local_50);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>
        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)
                            local_50);
        expected_03._M_str = "shared";
        expected_03._M_len = 6;
        ParseInput::takeKeyword(this,expected_03);
        type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._24_1_ = 0;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)
                        local_78);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_78,
                      (_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_c8)
      ;
      if (bVar4) {
        puVar1 = (undefined1 *)
                 ((long)&str.
                         super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                         ._M_payload + 8);
        local_50 = (undefined1  [8])puVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,local_78,
                   (undefined1 *)
                   (id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                    _M_len + (long)local_78));
        puVar2 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             = puVar2;
        if (local_50 == (undefined1  [8])puVar1) {
          *puVar2 = CONCAT71(str.
                             super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                             ._M_payload._9_7_,
                             str.
                             super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                             ._M_payload._8_1_);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           + 0x18) = str.
                     super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                     ._16_8_;
        }
        else {
          *(undefined1 (*) [8])
           &(__return_storage_ptr__->val).
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               = local_50;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                    + 0x10) =
               CONCAT71(str.
                        super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                        ._M_payload._9_7_,
                        str.
                        super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                        ._M_payload._8_1_);
        }
        *(size_t *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
         + 8) = str.
                super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                ._M_payload._M_value._M_len;
        str.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_payload._M_value._M_len = 0;
        str.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_payload._8_1_ = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
         + 0x20) = '\x02';
        local_50 = (undefined1  [8])puVar1;
        std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>
        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)
                            local_78);
        p_Var6 = (_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_c8;
        goto LAB_009f83a7;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)
                        local_78);
      p_Var6 = (_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_c8;
LAB_009f81b5:
      std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::
      ~_Variant_storage(p_Var6);
      bVar4 = ParseInput::takeRParen(this);
      if (bVar4) {
        std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>
        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)
                            local_78);
        if (bVar3) {
          std::__detail::__variant::
          _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_78)
          ;
        }
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
         + 0x20) = '\0';
      }
      else {
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e8,"expected end of memory declaration","");
        ParseInput::err((Err *)local_78,this,&local_e8);
        puVar2 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             = puVar2;
        puVar1 = (undefined1 *)
                 ((long)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Name>._M_payload + 8);
        if (local_78 == (undefined1  [8])puVar1) {
          *puVar2 = id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                    _M_str;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           + 0x18) = id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Name>._16_8_;
        }
        else {
          *(undefined1 (*) [8])
           &(__return_storage_ptr__->val).
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               = local_78;
          *(char **)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                    + 0x10) =
               id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_str
          ;
        }
        *(size_t *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
         + 8) = id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                _M_len;
        id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len = 0;
        id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_str =
             (char *)((ulong)id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                             super__Optional_payload_base<wasm::Name>._M_payload._M_value.
                             super_IString.str._M_str & 0xffffffffffffff00);
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
         + 0x20) = '\x02';
        local_118 = local_e8.field_2._M_allocated_capacity;
        _Var7._M_p = local_e8._M_dataplus._M_p;
        local_78 = (undefined1  [8])puVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) goto LAB_009f831f;
      }
    }
  }
LAB_009f83ac:
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
  ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                       *)((long)&exports.val.
                                 super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
                                 .
                                 super__Move_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>
                                 .
                                 super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>
                                 .
                                 super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>
                                 .
                                 super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>
                         + 0x20));
LAB_009f83b8:
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
  ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
                       *)local_178);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> memory(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("memory"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  auto exports = inlineExports(ctx.in);
  CHECK_ERR(exports);

  auto import = inlineImport(ctx.in);
  CHECK_ERR(import);

  std::optional<typename Ctx::MemTypeT> mtype;
  std::optional<typename Ctx::DataStringT> data;
  if (ctx.in.takeSExprStart("data"sv)) {
    if (import) {
      return ctx.in.err("imported memories cannot have inline data");
    }
    auto datastr = datastring(ctx);
    CHECK_ERR(datastr);
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of inline data");
    }
    mtype = ctx.makeMemType(Type::i32, ctx.getLimitsFromData(*datastr), false);
    data = *datastr;
  } else {
    auto type = memtype(ctx);
    CHECK_ERR(type);
    mtype = *type;
  }

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of memory declaration");
  }

  CHECK_ERR(ctx.addMemory(name, *exports, import.getPtr(), *mtype, pos));

  if (data) {
    CHECK_ERR(ctx.addImplicitData(std::move(*data)));
  }

  return Ok{};
}